

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attr.c
# Opt level: O2

int base64_decode(uchar *input,uchar *output)

{
  char cVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (output == (uchar *)0x0) {
    output = input;
  }
  uVar5 = 0;
  do {
    if ((ulong)*input == 0) {
LAB_0010528c:
      return (int)uVar5;
    }
    if (char_to_num[*input] == -1) {
      return -1;
    }
    cVar1 = char_to_num[input[1]];
    if (cVar1 == -1) {
      return -1;
    }
    bVar2 = input[2];
    uVar7 = (ulong)bVar2;
    if ((uVar7 != 0x3d) && (char_to_num[uVar7] == -1)) {
      return -1;
    }
    bVar3 = input[3];
    uVar6 = (ulong)bVar3;
    if ((uVar6 != 0x3d) && (char_to_num[uVar6] == -1)) {
      return -1;
    }
    output[uVar5] = cVar1 >> 4 | char_to_num[*input] << 2;
    if (bVar2 == 0x3d) {
      uVar5 = (ulong)((int)uVar5 + 1);
      goto LAB_0010528c;
    }
    cVar4 = char_to_num[uVar7];
    output[uVar5 + 1] = cVar4 >> 2 | cVar1 << 4;
    if (bVar3 == 0x3d) {
      uVar5 = (ulong)((int)uVar5 + 2);
      goto LAB_0010528c;
    }
    output[uVar5 + 2] = cVar4 << 6 | char_to_num[uVar6];
    uVar5 = uVar5 + 3;
    input = input + 4;
  } while( true );
}

Assistant:

static int 
base64_decode(unsigned char *input, unsigned char *output)
{
    int len = 0;
    int c1, c2, c3, c4;

    if (output == NULL) output = input;
    while (*input) {
	c1 = *input++;
	if (char_to_num[c1] == -1) return -1;
	c2 = *input++;
	if (char_to_num[c2] == -1) return -1;
	c3 = *input++;
	if (c3 != '=' && char_to_num[c3] == -1) return -1; 
	c4 = *input++;
	if (c4 != '=' && char_to_num[c4] == -1) return -1;
	*output++ = (char_to_num[c1] << 2) | (char_to_num[c2] >> 4);
	++len;
	if (c3 == '=') break;
	*output++ = ((char_to_num[c2] << 4) & 0xf0) | (char_to_num[c3] >> 2);
	++len;
	if (c4 == '=') break;
	*output++ = ((char_to_num[c3] << 6) & 0xc0) | char_to_num[c4];
	++len;
    }

    return len;
}